

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_yuv_rgb.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  uint8_t *puVar5;
  uint8_t *rgb;
  ulong __n;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  code *yuv2rgb_fun;
  long lVar10;
  uint32_t uVar11;
  undefined4 uVar12;
  uint uVar13;
  char *pcVar14;
  uint32_t uVar15;
  uint8_t *puVar16;
  size_t __n_00;
  ulong uVar17;
  uint i;
  int iVar18;
  undefined4 uVar19;
  undefined8 unaff_R13;
  ulong uVar20;
  uint8_t *puVar21;
  uint i_1;
  ulong uVar22;
  uint8_t *puVar23;
  long lVar24;
  uint32_t height;
  uint32_t width;
  ulong local_e0;
  uint8_t *local_d8;
  ulong local_d0;
  uint8_t *local_c8;
  uint8_t *local_c0;
  uint8_t *local_b8;
  uint8_t *local_b0;
  uint8_t *local_a8;
  uint8_t *local_a0;
  ulong local_98;
  char *local_90;
  uint8_t *RGB;
  uint8_t *YUV;
  ulong local_78;
  uint8_t *local_70;
  ulong local_68;
  uint8_t *local_60;
  undefined4 local_58;
  undefined4 local_54;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  uint8_t *RGBA;
  
  if (argc < 4) {
    puts(
        "Usage : test yuv2rgb <yuv image file> <image width> <image height> <output template filename>"
        );
    puts(
        "Or    : test yuv2rgb_nv12 <yuv image file> <image width> <image height> <output template filename>"
        );
    puts(
        "Or    : test yuv2rgb_nv21 <yuv image file> <image width> <image height> <output template filename>"
        );
    puts("Or    : test rgb2yuv <rgb24 binary ppm image file> <output template filename>");
    pcVar14 = "Or    : test rgba2yuv <rgb24 binary ppm image file> <output template filename>";
LAB_00102be2:
    puts(pcVar14);
    iVar6 = 1;
  }
  else {
    printf("Time will be measured in each configuration for %d iterations...\n",100);
    pcVar14 = argv[1];
    iVar6 = strcmp(pcVar14,"yuv2rgb");
    local_d8 = (uint8_t *)CONCAT44(local_d8._4_4_,iVar6);
    if (iVar6 == 0) {
      if ((uint)argc < 6) {
        pcVar14 = "Invalid argument number for yuv2rgb mode, call without argument to see usage.";
        goto LAB_00102be2;
      }
      uVar12 = 0;
LAB_00102ca5:
      uVar19 = 0;
LAB_00102caf:
      bVar2 = false;
LAB_00102cb1:
      bVar3 = false;
    }
    else {
      iVar6 = strcmp(pcVar14,"yuv2rgb_nv12");
      if (iVar6 == 0) {
        uVar12 = (undefined4)CONCAT71((uint7)(uint3)((uint)argc >> 8),1);
        goto LAB_00102ca5;
      }
      iVar6 = strcmp(pcVar14,"yuv2rgb_nv21");
      if (iVar6 == 0) {
        uVar19 = (undefined4)CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
        uVar12 = 0;
        goto LAB_00102caf;
      }
      iVar6 = strcmp(pcVar14,"rgb2yuv");
      if (iVar6 == 0) {
        bVar2 = true;
        uVar12 = 0;
        uVar19 = 0;
        goto LAB_00102cb1;
      }
      iVar6 = strcmp(pcVar14,"rgba2yuv");
      if (iVar6 != 0) {
        pcVar14 = "Invalid mode, call without argument to see usage.";
        goto LAB_00102be2;
      }
      bVar3 = true;
      uVar12 = 0;
      uVar19 = 0;
      bVar2 = false;
    }
    pcVar14 = argv[2];
    YUV = (uint8_t *)0x0;
    RGB = (uint8_t *)0x0;
    if ((byte)((byte)uVar12 | (byte)uVar19 | (int)local_d8 == 0) == 1) {
      uVar7 = atoi(argv[3]);
      width = uVar7;
      uVar8 = atoi(argv[4]);
      uVar22 = (ulong)uVar8;
      pcVar1 = argv[5];
      height = uVar8;
      iVar6 = readRawYUV(pcVar14,uVar7,uVar8,&YUV);
      if (iVar6 != 0) {
        pcVar14 = 
        "Error reading image file, check that the file exists and has the correct format and resolution."
        ;
        goto LAB_00102be2;
      }
      local_90 = pcVar1;
      local_58 = uVar19;
      local_54 = uVar12;
      RGB = (uint8_t *)malloc((ulong)(uVar7 * 3 * uVar8));
      local_c0 = YUV;
      local_c8 = YUV + uVar8 * uVar7;
      uVar13 = uVar7 + 1 >> 1;
      local_68 = (ulong)uVar13;
      uVar8 = uVar8 + 1 >> 1;
      local_a0 = (uint8_t *)(ulong)(uVar8 * uVar13);
      local_e0 = (ulong)((-uVar7 & 0xf) + uVar7);
      local_50 = (ulong)((-uVar13 & 0xf) + uVar13);
      uVar9 = local_e0;
      if ((int)local_d8 == 0) {
        uVar9 = local_50;
      }
      lVar10 = local_e0 * uVar22;
      local_60 = (uint8_t *)(uVar8 * uVar9);
      local_98 = uVar22;
      local_70 = RGB;
      local_48 = uVar22;
      local_40 = (ulong)uVar7;
      iVar6 = posix_memalign(&local_b0,0x10,lVar10 + (long)local_60 * 2);
      uVar8 = 0;
      puVar23 = (uint8_t *)0x0;
      if (iVar6 == 0) {
        puVar23 = local_b0;
      }
      local_a0 = local_c8 + (long)local_a0;
      local_78 = (ulong)((uVar7 * -3 & 0xf) + uVar7 * 3);
      local_b8 = puVar23 + lVar10;
      local_60 = local_b8 + (long)local_60;
      __n_00 = local_40 & 0xffffffff;
      uVar9 = local_40;
      uVar22 = local_48;
      local_d0 = __n_00;
      local_a8 = puVar23;
      for (uVar20 = 0; uVar11 = (uint32_t)uVar9, uVar20 < uVar22; uVar20 = uVar20 + 1) {
        memcpy(puVar23,local_c0 + uVar8,__n_00);
        __n = local_68;
        uVar4 = local_d0;
        if ((uVar20 & 1) == 0) {
          uVar17 = uVar20 >> 1 & 0x7fffffff;
          iVar6 = (int)uVar17;
          if ((int)local_d8 == 0) {
            lVar10 = uVar17 * local_50;
            iVar18 = (int)local_68;
            memcpy(local_b8 + lVar10,local_c8 + (uint)(iVar18 * iVar6),local_68);
            uVar9 = local_40;
            uVar22 = local_48;
            memcpy(local_60 + lVar10,local_a0 + (uint)(iVar18 * iVar6),__n);
            __n_00 = local_d0;
          }
          else {
            memcpy(local_b8 + uVar17 * local_e0,local_c8 + uVar11 * iVar6,local_d0);
            __n_00 = uVar4;
          }
        }
        puVar23 = puVar23 + local_e0;
        uVar8 = uVar8 + (int)uVar9;
      }
      iVar6 = posix_memalign(&local_b0,0x10,uVar22 * (local_78 & 0xffffffff));
      rgb = local_70;
      puVar16 = local_a0;
      puVar5 = local_c0;
      puVar21 = local_c8;
      puVar23 = local_b0;
      if (iVar6 != 0) {
        puVar23 = (uint8_t *)0x0;
      }
      uVar15 = (uint32_t)local_98;
      if ((int)local_d8 == 0) {
        local_d0 = (ulong)(uVar11 * 3);
        local_d8 = puVar23;
        test_yuv2rgb(uVar11,uVar15,local_c0,local_c8,local_a0,uVar11,(uint32_t)local_68,local_70,
                     uVar11 * 3,YCBCR_601,local_90,"std",100,yuv420_rgb24_std);
        pcVar14 = local_90;
        puVar23 = local_d8;
        test_yuv2rgb(uVar11,(uint32_t)local_98,puVar5,puVar21,puVar16,uVar11,(uint32_t)local_68,rgb,
                     (uint32_t)local_d0,YCBCR_601,local_90,"sse2_unaligned",100,yuv420_rgb24_sseu);
        puVar16 = local_a8;
        test_yuv2rgb(uVar11,(uint32_t)local_98,local_a8,local_b8,local_60,(uint32_t)local_e0,
                     (uint32_t)local_50,puVar23,(uint32_t)local_78,YCBCR_601,pcVar14,"sse2_aligned",
                     100,yuv420_rgb24_sse);
      }
      else {
        if ((char)local_54 == '\0') {
          puVar16 = local_a8;
          if ((char)local_58 == '\0') goto LAB_0010371f;
          local_d0 = (ulong)(uVar11 * 3);
          local_d8 = puVar23;
          test_yuvsp2rgb(uVar11,uVar15,local_c0,local_c8,uVar11,uVar11,local_70,uVar11 * 3,YCBCR_601
                         ,local_90,"std",100,nv21_rgb24_std);
          pcVar14 = local_90;
          puVar23 = local_d8;
          test_yuvsp2rgb(uVar11,uVar15,puVar5,puVar21,uVar11,uVar11,rgb,(uint32_t)local_d0,YCBCR_601
                         ,local_90,"sse2_unaligned",100,nv21_rgb24_sseu);
          yuv2rgb_fun = nv21_rgb24_sse;
        }
        else {
          local_d0 = (ulong)(uVar11 * 3);
          local_d8 = puVar23;
          test_yuvsp2rgb(uVar11,uVar15,local_c0,local_c8,uVar11,uVar11,local_70,uVar11 * 3,YCBCR_601
                         ,local_90,"std",100,nv12_rgb24_std);
          pcVar14 = local_90;
          puVar23 = local_d8;
          test_yuvsp2rgb(uVar11,uVar15,puVar5,puVar21,uVar11,uVar11,rgb,(uint32_t)local_d0,YCBCR_601
                         ,local_90,"sse2_unaligned",100,nv12_rgb24_sseu);
          yuv2rgb_fun = nv12_rgb24_sse;
        }
        puVar16 = local_a8;
        test_yuvsp2rgb(uVar11,(uint32_t)local_98,local_a8,local_b8,(uint32_t)local_e0,
                       (uint32_t)local_e0,puVar23,(uint32_t)local_78,YCBCR_601,pcVar14,
                       "sse2_aligned",100,yuv2rgb_fun);
      }
    }
    else if (bVar2) {
      puVar23 = (uint8_t *)argv[3];
      iVar6 = readPPM(pcVar14,&width,&height,&RGB);
      uVar15 = width;
      uVar11 = height;
      if (iVar6 != 0) {
LAB_00102e50:
        pcVar14 = "Error reading image file, check that the file exists and has the correct format."
        ;
        goto LAB_00102be2;
      }
      uVar22 = (ulong)height;
      local_a0 = (uint8_t *)(ulong)(height * width);
      local_c8 = puVar23;
      local_c0 = (uint8_t *)malloc((ulong)(height * width * 3 >> 1));
      uVar8 = uVar15 + 1 >> 1;
      local_b8 = (uint8_t *)(ulong)((uVar11 + 1 >> 1) * uVar8);
      local_e0 = (ulong)(-uVar8 & 0xf);
      uVar7 = (uVar15 * -3 & 0xf) + uVar15 * 3;
      YUV = local_c0;
      iVar6 = posix_memalign(&local_b0,0x10,uVar22 * uVar7);
      puVar23 = RGB;
      iVar18 = 0;
      puVar16 = (uint8_t *)0x0;
      if (iVar6 == 0) {
        puVar16 = local_b0;
      }
      uVar13 = (-uVar15 & 0xf) + uVar15;
      local_e0 = (ulong)((int)local_e0 + uVar8);
      local_d8 = puVar16;
      for (uVar22 = 0; uVar22 < height; uVar22 = uVar22 + 1) {
        memcpy(puVar16,puVar23 + iVar18 * width,(ulong)(width * 3));
        puVar16 = puVar16 + uVar7;
        iVar18 = iVar18 + 3;
      }
      puVar21 = local_c0 + (long)local_a0;
      local_b8 = puVar21 + (long)local_b8;
      lVar10 = (ulong)uVar13 * (ulong)height;
      lVar24 = (ulong)(height + 1 >> 1) * (local_e0 & 0xffffffff);
      iVar6 = posix_memalign(&local_b0,0x10,lVar10 + lVar24 * 2);
      puVar16 = local_b8;
      if (iVar6 != 0) {
        local_b0 = (uint8_t *)0x0;
      }
      local_d0 = (ulong)uVar13;
      local_a8 = local_b0;
      test_rgb2yuv(width,height,puVar23,width * 3,local_c0,puVar21,local_b8,width,width + 1 >> 1,
                   YCBCR_601,(char *)local_c8,"std",100,rgb24_yuv420_std);
      puVar5 = local_c8;
      test_rgb2yuv(width,height,puVar23,width * 3,local_c0,puVar21,puVar16,width,width + 1 >> 1,
                   YCBCR_601,(char *)local_c8,"sse2_unaligned",100,rgb24_yuv420_sseu);
      puVar16 = local_a8;
      puVar23 = local_d8;
      test_rgb2yuv(width,height,local_d8,uVar7,local_a8,local_b0 + lVar10,local_b0 + lVar10 + lVar24
                   ,(uint32_t)local_d0,(uint32_t)local_e0,YCBCR_601,(char *)puVar5,"sse2_aligned",
                   100,rgb24_yuv420_sse);
    }
    else if (bVar3) {
      puVar23 = (uint8_t *)argv[3];
      iVar6 = readPPM(pcVar14,&width,&height,&RGB);
      if (iVar6 != 0) goto LAB_00102e50;
      RGBA = (uint8_t *)0x0;
      local_c8 = puVar23;
      convert_rgb_to_rgba(RGB,width,height,&RGBA);
      uVar15 = width;
      uVar11 = height;
      uVar22 = (ulong)height;
      local_a0 = (uint8_t *)(ulong)(height * width);
      local_c0 = (uint8_t *)malloc((ulong)(height * width * 3 >> 1));
      uVar8 = uVar15 + 1 >> 1;
      local_b8 = (uint8_t *)(ulong)((uVar11 + 1 >> 1) * uVar8);
      local_e0 = (ulong)(-uVar8 & 0xf);
      uVar7 = (uVar15 * -4 & 0xc) + uVar15 * 4;
      YUV = local_c0;
      iVar6 = posix_memalign(&local_b0,0x10,uVar22 * uVar7);
      puVar23 = RGBA;
      iVar18 = 0;
      puVar16 = (uint8_t *)0x0;
      if (iVar6 == 0) {
        puVar16 = local_b0;
      }
      uVar13 = (-uVar15 & 0xf) + uVar15;
      local_e0 = (ulong)((int)local_e0 + uVar8);
      local_d8 = puVar16;
      for (uVar22 = 0; uVar22 < height; uVar22 = uVar22 + 1) {
        memcpy(puVar16,puVar23 + iVar18 * width,(ulong)(width << 2));
        iVar18 = iVar18 + 4;
        puVar16 = puVar16 + uVar7;
      }
      puVar21 = local_c0 + (long)local_a0;
      local_b8 = puVar21 + (long)local_b8;
      lVar10 = (ulong)uVar13 * (ulong)height;
      lVar24 = (ulong)(height + 1 >> 1) * (local_e0 & 0xffffffff);
      iVar6 = posix_memalign(&local_b0,0x10,lVar10 + lVar24 * 2);
      puVar16 = local_b8;
      if (iVar6 != 0) {
        local_b0 = (uint8_t *)0x0;
      }
      local_d0 = (ulong)uVar13;
      local_a8 = local_b0;
      test_rgb2yuv(width,height,puVar23,width * 4,local_c0,puVar21,local_b8,width,width + 1 >> 1,
                   YCBCR_601,(char *)local_c8,"std",100,rgb32_yuv420_std);
      puVar5 = local_c8;
      test_rgb2yuv(width,height,puVar23,width * 4,local_c0,puVar21,puVar16,width,width + 1 >> 1,
                   YCBCR_601,(char *)local_c8,"sse2_unaligned",100,rgb32_yuv420_sseu);
      puVar16 = local_a8;
      puVar23 = local_d8;
      test_rgb2yuv(width,height,local_d8,uVar7,local_a8,local_b0 + lVar10,local_b0 + lVar10 + lVar24
                   ,(uint32_t)local_d0,(uint32_t)local_e0,YCBCR_601,(char *)puVar5,"sse2_aligned",
                   100,rgb32_yuv420_sse);
      free(RGBA);
    }
    else {
      puVar23 = (uint8_t *)0x0;
      puVar16 = (uint8_t *)0x0;
    }
LAB_0010371f:
    free(puVar23);
    free(puVar16);
    free(RGB);
    free(YUV);
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int main(int argc, char **argv)
{
	if(argc<4)
	{
		printf("Usage : test yuv2rgb <yuv image file> <image width> <image height> <output template filename>\n");
		printf("Or    : test yuv2rgb_nv12 <yuv image file> <image width> <image height> <output template filename>\n");
		printf("Or    : test yuv2rgb_nv21 <yuv image file> <image width> <image height> <output template filename>\n");
		printf("Or    : test rgb2yuv <rgb24 binary ppm image file> <output template filename>\n");
		printf("Or    : test rgba2yuv <rgb24 binary ppm image file> <output template filename>\n");
		return 1;
	}
	
	const int iteration_number = 100;
	printf("Time will be measured in each configuration for %d iterations...\n", iteration_number);
	const YCbCrType yuv_format = YCBCR_601;
	//const YCbCrType yuv_format = YCBCR_709;
	//const YCbCrType yuv_format = YCBCR_JPEG;
	
	Mode mode;
	if(strcmp(argv[1], "yuv2rgb")==0)
	{
		mode=YUV2RGB;
		if(argc<6)
		{
			printf("Invalid argument number for yuv2rgb mode, call without argument to see usage.\n");
			return 1;
		}
	}
	else if(strcmp(argv[1], "yuv2rgb_nv12")==0)
	{
		mode=YUV2RGB_NV12;
	}
	else if(strcmp(argv[1], "yuv2rgb_nv21")==0)
	{
		mode=YUV2RGB_NV21;
	}
	else if(strcmp(argv[1], "rgb2yuv")==0)
	{
		mode=RGB2YUV;
	}
	else if(strcmp(argv[1], "rgba2yuv")==0)
	{
		mode=RGBA2YUV;
	}
	else
	{
		printf("Invalid mode, call without argument to see usage.\n");
		return 1;
	}
	
	const char *filename = argv[2];
	uint32_t width, height;
	const char *out;
	uint8_t *YUV=NULL, *RGB=NULL, *Y=NULL, *U=NULL, *V=NULL, *RGBa=NULL, *YUVa=NULL, *Ya=NULL, *Ua=NULL, *Va=NULL;
	
	if(mode==YUV2RGB || mode==YUV2RGB_NV12 ||  mode==YUV2RGB_NV21)
	{
		//parse argument line
		width = atoi(argv[3]);
		height = atoi(argv[4]);
		out = argv[5];
		
		// read input data and allocate output data
		if(readRawYUV(filename, width, height, &YUV)!=0)
		{
			printf("Error reading image file, check that the file exists and has the correct format and resolution.\n");
			return 1;
		}
		
#if USE_FFMPEG
		yuv2rgb_swscale_ctx = sws_getContext(width, height, AV_PIX_FMT_YUV420P, width, height, AV_PIX_FMT_RGB24, 0, 0, 0, 0);
#endif
		
		RGB = malloc(3*width*height);
		
		Y = YUV;
		U = YUV+width*height;
		V = YUV+width*height+((width+1)/2)*((height+1)/2);
		
		// allocate aligned data
		const size_t y_stride = width + (16-width%16)%16;
		const size_t uv_stride = (mode==YUV2RGB) ? (width+1)/2 + (16-((width+1)/2)%16)%16 : y_stride;
		const size_t rgb_stride = width*3 +(16-(3*width)%16)%16;
	
		const size_t y_size = y_stride*height, uv_size = uv_stride*((height+1)/2);
		YUVa = _mm_malloc(y_size+2*uv_size, 16);
		Ya = YUVa;
		Ua = YUVa+y_size;
		Va = YUVa+y_size+uv_size;
		for(unsigned int i=0; i<height; ++i)
		{
			memcpy(Ya+i*y_stride, Y+i*width, width);
			if((i%2)==0)
			{
				if(mode==YUV2RGB)
				{
					memcpy(Ua+(i/2)*uv_stride, U+(i/2)*((width+1)/2), (width+1)/2);
					memcpy(Va+(i/2)*uv_stride, V+(i/2)*((width+1)/2), (width+1)/2);
				}
				else
				{
					memcpy(Ua+(i/2)*uv_stride, U+(i/2)*width, width);
				}
			}
		}
		
		RGBa = _mm_malloc(rgb_stride*height, 16);
		
		// test all versions
		if(mode==YUV2RGB)
		{
			test_yuv2rgb(width, height, Y, U, V, width, (width+1)/2, RGB, width*3, yuv_format, 
				out, "std", iteration_number, yuv420_rgb24_std);
			test_yuv2rgb(width, height, Y, U, V, width, (width+1)/2, RGB, width*3, yuv_format, 
				out, "sse2_unaligned", iteration_number, yuv420_rgb24_sseu);
#if USE_FFMPEG
			test_yuv2rgb(width, height, Y, U, V, width, (width+1)/2, RGB, width*3, yuv_format, 
				out, "ffmpeg_unaligned", iteration_number, yuv420_rgb24_ffmpeg);
#endif
#if USE_IPP
			test_yuv2rgb(width, height, Y, U, V, width, (width+1)/2, RGB, width*3, yuv_format, 
				out, "ipp_unaligned", iteration_number, yuv420_rgb24_ipp);
#endif
			test_yuv2rgb(width, height, Ya, Ua, Va, y_stride, uv_stride, RGBa, rgb_stride, yuv_format, 
				out, "sse2_aligned", iteration_number, yuv420_rgb24_sse);
#if USE_FFMPEG
			test_yuv2rgb(width, height, Ya, Ua, Va, y_stride, uv_stride, RGBa, rgb_stride, yuv_format, 
				out, "ffmpeg_aligned", iteration_number, yuv420_rgb24_ffmpeg);
#endif
#if USE_IPP
			test_yuv2rgb(width, height, Ya, Ua, Va, y_stride, uv_stride, RGBa, rgb_stride, yuv_format, 
				out, "ipp_aligned", iteration_number, yuv420_rgb24_ipp);
#endif
		}
		else if(mode==YUV2RGB_NV12)
		{
			test_yuvsp2rgb(width, height, Y, U, width, width, RGB, width*3, yuv_format, 
				out, "std", iteration_number, nv12_rgb24_std);
			test_yuvsp2rgb(width, height, Y, U, width, width, RGB, width*3, yuv_format, 
				out, "sse2_unaligned", iteration_number, nv12_rgb24_sseu);
			test_yuvsp2rgb(width, height, Ya, Ua, y_stride, uv_stride, RGBa, rgb_stride, yuv_format, 
				out, "sse2_aligned", iteration_number, nv12_rgb24_sse);
		}
		else if(mode==YUV2RGB_NV21)
		{
			test_yuvsp2rgb(width, height, Y, U, width, width, RGB, width*3, yuv_format, 
				out, "std", iteration_number, nv21_rgb24_std);
			test_yuvsp2rgb(width, height, Y, U, width, width, RGB, width*3, yuv_format, 
				out, "sse2_unaligned", iteration_number, nv21_rgb24_sseu);
			test_yuvsp2rgb(width, height, Ya, Ua, y_stride, uv_stride, RGBa, rgb_stride, yuv_format, 
				out, "sse2_aligned", iteration_number, nv21_rgb24_sse);
		}
	}
	else if(mode==RGB2YUV)
	{
		//parse argument line
		out = argv[3];
		
		// read input data and allocate output data
		if(readPPM(filename, &width, &height, &RGB)!=0)
		{
			printf("Error reading image file, check that the file exists and has the correct format.\n");
			return 1;
		}
		
#if USE_FFMPEG
		rgb2yuv_swscale_ctx = sws_getContext(width, height, AV_PIX_FMT_RGB24, width, height, AV_PIX_FMT_YUV420P, 0, 0, 0, 0);
#endif
		
		YUV = malloc(width*height*3/2);
		
		Y = YUV;
		U = YUV+width*height;
		V = YUV+width*height+((width+1)/2)*((height+1)/2);
		
		// allocate aligned data
		const size_t y_stride = width + (16-width%16)%16,
		uv_stride = (width+1)/2 + (16-((width+1)/2)%16)%16,
		rgb_stride = width*3 +(16-(3*width)%16)%16;
		
		RGBa = _mm_malloc(rgb_stride*height, 16);
		for(unsigned int i=0; i<height; ++i)
		{
			memcpy(RGBa+i*rgb_stride, RGB+i*width*3, width*3);
		}
		
		const size_t y_size = y_stride*height, uv_size = uv_stride*((height+1)/2);
		YUVa = _mm_malloc(y_size+2*uv_size, 16);
		Ya = YUVa;
		Ua = YUVa+y_size;
		Va = YUVa+y_size+uv_size;

		
		// test all versions
		test_rgb2yuv(width, height, RGB, width*3, Y, U, V, width, (width+1)/2, yuv_format, 
			out, "std", iteration_number, rgb24_yuv420_std);
		test_rgb2yuv(width, height, RGB, width*3, Y, U, V, width, (width+1)/2, yuv_format, 
			out, "sse2_unaligned", iteration_number, rgb24_yuv420_sseu);
#if USE_FFMPEG
		test_rgb2yuv(width, height, RGB, width*3, Y, U, V, width, (width+1)/2, yuv_format, 
			out, "ffmpeg_unaligned", iteration_number, rgb24_yuv420_ffmpeg);
#endif
#if USE_IPP
		test_rgb2yuv(width, height, RGB, width*3, Y, U, V, width, (width+1)/2, yuv_format, 
			out, "ipp_unaligned", iteration_number, rgb24_yuv420_ipp);
#endif
		test_rgb2yuv(width, height, RGBa, rgb_stride, Ya, Ua, Va, y_stride, uv_stride, yuv_format, 
			out, "sse2_aligned", iteration_number, rgb24_yuv420_sse);
#if USE_FFMPEG
		test_rgb2yuv(width, height, RGBa, rgb_stride, Ya, Ua, Va, y_stride, uv_stride, yuv_format, 
			out, "ffmpeg_aligned", iteration_number, rgb24_yuv420_ffmpeg);
#endif
#if USE_IPP
		test_rgb2yuv(width, height, RGBa, rgb_stride, Ya, Ua, Va, y_stride, uv_stride, yuv_format, 
			out, "ipp_aligned", iteration_number, rgb24_yuv420_ipp);
#endif
	}
	else if(mode==RGBA2YUV)
	{
		//parse argument line
		out = argv[3];
		
		// read input data and allocate output data
		if(readPPM(filename, &width, &height, &RGB)!=0)
		{
			printf("Error reading image file, check that the file exists and has the correct format.\n");
			return 1;
		}
		// convert rgb to rgba
		uint8_t *RGBA = NULL;
		convert_rgb_to_rgba(RGB, width, height, &RGBA);
		
		YUV = malloc(width*height*3/2);
		
		Y = YUV;
		U = YUV+width*height;
		V = YUV+width*height+((width+1)/2)*((height+1)/2);
		
		// allocate aligned data
		const size_t y_stride = width + (16-width%16)%16,
		uv_stride = (width+1)/2 + (16-((width+1)/2)%16)%16,
		rgba_stride = width*4 +(16-(4*width)%16)%16;
		
		RGBa = _mm_malloc(rgba_stride*height, 16);
		for(unsigned int i=0; i<height; ++i)
		{
			memcpy(RGBa+i*rgba_stride, RGBA+i*width*4, width*4);
		}
		
		const size_t y_size = y_stride*height, uv_size = uv_stride*((height+1)/2);
		YUVa = _mm_malloc(y_size+2*uv_size, 16);
		Ya = YUVa;
		Ua = YUVa+y_size;
		Va = YUVa+y_size+uv_size;
		
		// test all versions
		test_rgb2yuv(width, height, RGBA, width*4, Y, U, V, width, (width+1)/2, yuv_format, 
			out, "std", iteration_number, rgb32_yuv420_std);
		test_rgb2yuv(width, height, RGBA, width*4, Y, U, V, width, (width+1)/2, yuv_format, 
			out, "sse2_unaligned", iteration_number, rgb32_yuv420_sseu);
		test_rgb2yuv(width, height, RGBa, rgba_stride, Ya, Ua, Va, y_stride, uv_stride, yuv_format, 
			out, "sse2_aligned", iteration_number, rgb32_yuv420_sse);
		
		free(RGBA);
	}
	
	_mm_free(RGBa);
	_mm_free(YUVa);
	free(RGB);
	free(YUV);
	
	return 0;
}